

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

_Bool hydro_equal(void *b1_,void *b2_,size_t len)

{
  byte bVar1;
  size_t sVar2;
  uint8_t *b1;
  
  bVar1 = -(b1_ == b2_);
  for (sVar2 = 0; len != sVar2; sVar2 = sVar2 + 1) {
    bVar1 = bVar1 | *(byte *)((long)b1_ + sVar2) ^ *(byte *)((long)b2_ + sVar2);
  }
  return (_Bool)((byte)(bVar1 - 1 >> 8) & 1);
}

Assistant:

bool
hydro_equal(const void *b1_, const void *b2_, size_t len)
{
    const volatile uint8_t *volatile b1 = (const volatile uint8_t *volatile) b1_;
    const uint8_t *b2                   = (const uint8_t *) b2_;
    size_t         i;
    uint8_t        d = (uint8_t) 0U;

    if (b1 == b2) {
        d = ~d;
    }
    for (i = 0U; i < len; i++) {
        d |= b1[i] ^ b2[i];
    }
    return (bool) (1 & ((d - 1) >> 8));
}